

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void __thiscall
duckdb::ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_>::ModeRm
          (ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_> *this,
          idx_t frame)

{
  ColumnDataScanState *pCVar1;
  uhugeint_t *puVar2;
  size_t sVar3;
  char cVar4;
  reference pvVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  
  pCVar1 = this->scan;
  if ((pCVar1->next_row_index <= frame) || (uVar6 = pCVar1->current_row_index, frame < uVar6)) {
    duckdb::ColumnDataCollection::Seek
              ((ulong)this->inputs,(ColumnDataScanState *)frame,(DataChunk *)pCVar1);
    pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)&this->page,0)
    ;
    this->data = *(uhugeint_t **)(pvVar5 + 0x20);
    pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)&this->page,0)
    ;
    FlatVector::VerifyFlatVector(pvVar5);
    this->validity = (ValidityMask *)(pvVar5 + 0x28);
    uVar6 = this->scan->current_row_index;
  }
  puVar2 = this->data;
  pmVar7 = std::__detail::
           _Map_base<duckdb::uhugeint_t,_std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::uhugeint_t>,_std::hash<duckdb::uhugeint_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::uhugeint_t,_std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::uhugeint_t>,_std::hash<duckdb::uhugeint_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this->frequency_map,puVar2 + (uint)((int)frame - (int)uVar6));
  sVar3 = pmVar7->count;
  this->nonzero = this->nonzero - (ulong)(sVar3 == 1);
  pmVar7->count = sVar3 - 1;
  if (this->count == sVar3) {
    cVar4 = duckdb::uhugeint_t::operator==(puVar2 + (uint)((int)frame - (int)uVar6),this->mode);
    if (cVar4 != '\0') {
      this->valid = false;
    }
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}